

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_tai.cpp
# Opt level: O3

caltime * __thiscall Kumu::TAI::caltime::operator=(caltime *this,tai *rhs)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  
  uVar2 = rhs->x + 0xe476;
  iVar3 = (int)(uVar2 / 0x15180);
  uVar1 = (int)uVar2 + iVar3 * -0x15180;
  this->second = uVar1 % 0x3c;
  this->minute = uVar1 / 0x3c + ((uVar1 / 0x3c & 0xffff) / 0x3c) * -0x3c & 0xffff;
  this->hour = uVar1 / 0xe10;
  caldate_frommjd(&this->date,iVar3 + 0x6ebf01e8);
  this->offset = 0;
  return this;
}

Assistant:

const Kumu::TAI::caltime&
Kumu::TAI::caltime::operator=(const Kumu::TAI::tai& rhs)
{
  caltime_utc(this, &rhs);
  return *this;
}